

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# necro.c
# Opt level: O0

void make_urn(CHAR_DATA *ch,OBJ_DATA *corpse)

{
  char *pcVar1;
  long in_RSI;
  __type_conflict2 _Var2;
  char buf [4608];
  void *in_stack_ffffffffffffede8;
  char *in_stack_ffffffffffffedf0;
  CHAR_DATA *in_stack_ffffffffffffedf8;
  char *in_stack_ffffffffffffee00;
  OBJ_DATA *in_stack_ffffffffffffee10;
  char *in_stack_ffffffffffffee18;
  
  act(in_stack_ffffffffffffee00,in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0,
      in_stack_ffffffffffffede8,0);
  act(in_stack_ffffffffffffee00,in_stack_ffffffffffffedf8,in_stack_ffffffffffffedf0,
      in_stack_ffffffffffffede8,0);
  if (*(short *)(in_RSI + 0x98) == 0x17) {
    extract_obj(in_stack_ffffffffffffee10);
  }
  else if ((*(short *)(in_RSI + 0x98) == 0x18) && (*(long *)(in_RSI + 0x78) != 0)) {
    free_pstring(in_stack_ffffffffffffedf0);
    snprintf(&stack0xffffffffffffede8,0x1200,"The defiled corpse of %s is here, its heart missing.",
             *(undefined8 *)(in_RSI + 0x78));
    pcVar1 = palloc_string(in_stack_ffffffffffffee18);
    *(char **)(in_RSI + 0x90) = pcVar1;
    _Var2 = std::pow<int,int>(0,0x6c58c7);
    *(ulong *)(in_RSI + 0xb0) = (long)_Var2 | *(ulong *)(in_RSI + 0xb0);
  }
  return;
}

Assistant:

void make_urn(CHAR_DATA *ch, OBJ_DATA *corpse)
{
	char buf[MSL];

	act("When this morbid sculpting is complete, $n is holding a solid receptacle.", ch, 0, 0, TO_ROOM);
	act("You craft a morbid urn from the coagulated blood of $p!", ch, corpse, 0, TO_CHAR);

	if (corpse->item_type == ITEM_CORPSE_NPC)
	{
		extract_obj(corpse);
	}
	else if (corpse->item_type == ITEM_CORPSE_PC && corpse->owner)
	{
		free_pstring(corpse->description);
		
		std::snprintf(buf, static_cast<size_t>(MSL), "The defiled corpse of %s is here, its heart missing.", corpse->owner);
		corpse->description = palloc_string(buf);
		SET_BIT(corpse->wear_flags, CORPSE_NO_ANIMATE);
	}
}